

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

json_t * json_load_file(char *path,size_t flags,json_error_t *error)

{
  FILE *__stream;
  json_t *pjVar1;
  int *piVar2;
  char *pcVar3;
  
  jsonp_error_init(error,path);
  if (path == (char *)0x0) {
    error_set(error,(lex_t *)0x0,"wrong arguments");
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream != (FILE *)0x0) {
      pjVar1 = json_loadf((FILE *)__stream,flags,error);
      fclose(__stream);
      return pjVar1;
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    error_set(error,(lex_t *)0x0,"unable to open %s: %s",path,pcVar3);
  }
  return (json_t *)0x0;
}

Assistant:

json_t *json_load_file(const char *path, size_t flags, json_error_t *error)
{
	json_t *result;
	FILE *fp;

	jsonp_error_init(error, path);

	if (path == NULL) {
		error_set(error, NULL, "wrong arguments");
		return NULL;
	}

	fp = fopen(path, "rb");
	if (!fp)
	{
		error_set(error, NULL, "unable to open %s: %s",
			path, strerror(errno));
		return NULL;
	}

	result = json_loadf(fp, flags, error);

	fclose(fp);
	return result;
}